

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

QPointF __thiscall QWidget::mapFrom(QWidget *this,QWidget *parent,QPointF *pos)

{
  QWidget *w;
  long in_FS_OFFSET;
  QPointF QVar1;
  char local_58 [24];
  char *local_40;
  QPointF local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.xp = pos->xp;
  local_38.yp = pos->yp;
  if (parent != (QWidget *)0x0) {
    do {
      if (this == parent) goto LAB_002f6f5d;
      QVar1 = mapFromParent(this,&local_38);
      local_38.yp = QVar1.yp;
      local_38.xp = QVar1.xp;
      this = *(QWidget **)(*(long *)&this->field_0x8 + 0x10);
    } while (this != (QWidget *)0x0);
    local_58[0] = '\x02';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_40 = "default";
    QMessageLogger::warning(local_58,"QWidget::mapFrom(): parent must be in parent hierarchy");
  }
LAB_002f6f5d:
  QVar1.yp = local_38.yp;
  QVar1.xp = local_38.xp;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QPointF QWidget::mapFrom(const QWidget *parent, const QPointF &pos) const
{
    QPointF p(pos);
    if (parent) {
        const QWidget * w = this;
        while (w != parent) {
            p = w->mapFromParent(p);
            w = w->parentWidget();
            if (!w) {
                qWarning("QWidget::mapFrom(): parent must be in parent hierarchy");
                break;
            }
        }
    }
    return p;
}